

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_UpdateF0(ARKodeMem ark_mem,ARKodeMRIStepMem step_mem,sunrealtype t,N_Vector y,int mode)

{
  int iVar1;
  int in_ECX;
  N_Vector in_RDX;
  ARKodeMRIStepMem in_RSI;
  ARKodeMem in_RDI;
  ARKodeMem in_XMM0_Qa;
  int retval;
  int nvec;
  int local_30 [2];
  N_Vector local_28;
  ARKodeMem local_20;
  ARKodeMRIStepMem local_18;
  ARKodeMem local_10;
  
  local_28 = in_RDX;
  local_20 = in_XMM0_Qa;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_ECX == 0) {
    if ((in_RSI->explicit_rhs != 0) &&
       ((in_RSI->fse_is_current == 0 || (in_RDI->fn_is_current == 0)))) {
      iVar1 = (*in_RSI->fse)((sunrealtype)in_XMM0_Qa,in_RDX,*in_RSI->Fse,in_RDI->user_data);
      local_18->nfse = local_18->nfse + 1;
      if (iVar1 != 0) {
        arkProcessError(local_20,(int)local_10,-8,(char *)0x637,"mriStep_UpdateF0",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                        ,
                        "At t = %.15g, the right-hand side routine failed in an unrecoverable manner."
                       );
        return -8;
      }
      local_18->fse_is_current = 1;
      if (local_18->expforcing != 0) {
        *local_18->cvals = 1.0;
        *local_18->Xvecs = *local_18->Fse;
        local_30[0] = 1;
        mriStep_ApplyForcing(local_18,(sunrealtype)local_20,1.0,local_30);
        N_VLinearCombination(local_30[0],local_18->cvals,local_18->Xvecs,*local_18->Fse);
      }
    }
    if ((local_18->implicit_rhs != 0) &&
       ((local_18->fsi_is_current == 0 || (local_10->fn_is_current == 0)))) {
      iVar1 = (*local_18->fsi)((sunrealtype)local_20,local_28,*local_18->Fsi,local_10->user_data);
      local_18->nfsi = local_18->nfsi + 1;
      if (iVar1 != 0) {
        arkProcessError(local_20,(int)local_10,-8,(char *)0x654,"mriStep_UpdateF0",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                        ,
                        "At t = %.15g, the right-hand side routine failed in an unrecoverable manner."
                       );
        return -8;
      }
      local_18->fsi_is_current = 1;
      if (local_18->impforcing != 0) {
        *local_18->cvals = 1.0;
        *local_18->Xvecs = *local_18->Fsi;
        local_30[0] = 1;
        mriStep_ApplyForcing(local_18,(sunrealtype)local_20,1.0,local_30);
        N_VLinearCombination(local_30[0],local_18->cvals,local_18->Xvecs,*local_18->Fsi);
      }
    }
  }
  else {
    if (in_ECX != 1) {
      arkProcessError(in_RDI,-8,0x6a5,"mriStep_UpdateF0",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                      ,"Unknown full RHS mode");
      return -8;
    }
    if (in_RDI->fn_is_current == 0) {
      if (in_RSI->explicit_rhs != 0) {
        iVar1 = (*in_RSI->fse)((sunrealtype)in_XMM0_Qa,in_RDX,*in_RSI->Fse,in_RDI->user_data);
        local_18->nfse = local_18->nfse + 1;
        if (iVar1 != 0) {
          arkProcessError(local_20,(int)local_10,-8,(char *)0x675,"mriStep_UpdateF0",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                          ,
                          "At t = %.15g, the right-hand side routine failed in an unrecoverable manner."
                         );
          return -8;
        }
        local_18->fse_is_current = 1;
        if (local_18->expforcing != 0) {
          *local_18->cvals = 1.0;
          *local_18->Xvecs = *local_18->Fse;
          local_30[0] = 1;
          mriStep_ApplyForcing(local_18,(sunrealtype)local_20,1.0,local_30);
          N_VLinearCombination(local_30[0],local_18->cvals,local_18->Xvecs,*local_18->Fse);
        }
      }
      if (local_18->implicit_rhs != 0) {
        iVar1 = (*local_18->fsi)((sunrealtype)local_20,local_28,*local_18->Fsi,local_10->user_data);
        local_18->nfsi = local_18->nfsi + 1;
        if (iVar1 != 0) {
          arkProcessError(local_20,(int)local_10,-8,(char *)0x68e,"mriStep_UpdateF0",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                          ,
                          "At t = %.15g, the right-hand side routine failed in an unrecoverable manner."
                         );
          return -8;
        }
        local_18->fsi_is_current = 1;
        if (local_18->impforcing != 0) {
          *local_18->cvals = 1.0;
          *local_18->Xvecs = *local_18->Fsi;
          local_30[0] = 1;
          mriStep_ApplyForcing(local_18,(sunrealtype)local_20,1.0,local_30);
          N_VLinearCombination(local_30[0],local_18->cvals,local_18->Xvecs,*local_18->Fsi);
        }
      }
    }
  }
  return 0;
}

Assistant:

int mriStep_UpdateF0(ARKodeMem ark_mem, ARKodeMRIStepMem step_mem,
                     sunrealtype t, N_Vector y, int mode)
{
  int nvec, retval;

  /* perform RHS functions contingent on 'mode' argument */
  switch (mode)
  {
  case ARK_FULLRHS_START:

    /* update the RHS components */

    /*   explicit component */
    if (step_mem->explicit_rhs)
    {
      /* if either ARKODE or MRIStep consider Fse[0] stale, then recompute */
      if (!step_mem->fse_is_current || !ark_mem->fn_is_current)
      {
        retval = step_mem->fse(t, y, step_mem->Fse[0], ark_mem->user_data);
        step_mem->nfse++;
        if (retval != 0)
        {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                          __FILE__, MSG_ARK_RHSFUNC_FAILED, t);
          return (ARK_RHSFUNC_FAIL);
        }
        step_mem->fse_is_current = SUNTRUE;

        /* Add external forcing, if applicable */
        if (step_mem->expforcing)
        {
          step_mem->cvals[0] = ONE;
          step_mem->Xvecs[0] = step_mem->Fse[0];
          nvec               = 1;
          mriStep_ApplyForcing(step_mem, t, ONE, &nvec);
          N_VLinearCombination(nvec, step_mem->cvals, step_mem->Xvecs,
                               step_mem->Fse[0]);
        }
      }
    }

    /*   implicit component */
    if (step_mem->implicit_rhs)
    {
      /* if either ARKODE or MRIStep consider Fsi[0] stale, then recompute */
      if (!step_mem->fsi_is_current || !ark_mem->fn_is_current)
      {
        retval = step_mem->fsi(t, y, step_mem->Fsi[0], ark_mem->user_data);
        step_mem->nfsi++;
        if (retval != 0)
        {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                          __FILE__, MSG_ARK_RHSFUNC_FAILED, t);
          return (ARK_RHSFUNC_FAIL);
        }
        step_mem->fsi_is_current = SUNTRUE;

        /* Add external forcing, if applicable */
        if (step_mem->impforcing)
        {
          step_mem->cvals[0] = ONE;
          step_mem->Xvecs[0] = step_mem->Fsi[0];
          nvec               = 1;
          mriStep_ApplyForcing(step_mem, t, ONE, &nvec);
          N_VLinearCombination(nvec, step_mem->cvals, step_mem->Xvecs,
                               step_mem->Fsi[0]);
        }
      }
    }

    break;

  case ARK_FULLRHS_END:

    /* compute the full RHS */
    if (!(ark_mem->fn_is_current))
    {
      /* compute the explicit component */
      if (step_mem->explicit_rhs)
      {
        retval = step_mem->fse(t, y, step_mem->Fse[0], ark_mem->user_data);
        step_mem->nfse++;
        if (retval != 0)
        {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                          __FILE__, MSG_ARK_RHSFUNC_FAILED, t);
          return (ARK_RHSFUNC_FAIL);
        }
        step_mem->fse_is_current = SUNTRUE;

        /* Add external forcing, as appropriate */
        if (step_mem->expforcing)
        {
          step_mem->cvals[0] = ONE;
          step_mem->Xvecs[0] = step_mem->Fse[0];
          nvec               = 1;
          mriStep_ApplyForcing(step_mem, t, ONE, &nvec);
          N_VLinearCombination(nvec, step_mem->cvals, step_mem->Xvecs,
                               step_mem->Fse[0]);
        }
      }

      /* compute the implicit component */
      if (step_mem->implicit_rhs)
      {
        retval = step_mem->fsi(t, y, step_mem->Fsi[0], ark_mem->user_data);
        step_mem->nfsi++;
        if (retval != 0)
        {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                          __FILE__, MSG_ARK_RHSFUNC_FAILED, t);
          return (ARK_RHSFUNC_FAIL);
        }
        step_mem->fsi_is_current = SUNTRUE;

        /* Add external forcing, as appropriate */
        if (step_mem->impforcing)
        {
          step_mem->cvals[0] = ONE;
          step_mem->Xvecs[0] = step_mem->Fsi[0];
          nvec               = 1;
          mriStep_ApplyForcing(step_mem, t, ONE, &nvec);
          N_VLinearCombination(nvec, step_mem->cvals, step_mem->Xvecs,
                               step_mem->Fsi[0]);
        }
      }
    }

    break;

  default:
    /* return with RHS failure if unknown mode is requested */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    "Unknown full RHS mode");
    return (ARK_RHSFUNC_FAIL);
  }

  return (ARK_SUCCESS);
}